

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O1

void __thiscall MT32Emu::TVF::startDecay(TVF *this)

{
  Bit8u BVar1;
  Bit8u increment;
  
  if (5 < this->phase) {
    return;
  }
  BVar1 = (this->partialParam->tvf).envTime[4];
  increment = '\x01';
  if (BVar1 != '\0') {
    increment = -BVar1;
  }
  this->target = '\0';
  this->phase = 6;
  LA32Ramp::startRamp(this->cutoffModifierRamp,'\0',increment);
  return;
}

Assistant:

void TVF::startDecay() {
	if (phase >= PHASE_RELEASE) {
		return;
	}
	if (partialParam->tvf.envTime[4] == 0) {
		startRamp(0, 1, PHASE_DONE - 1);
	} else {
		startRamp(0, -partialParam->tvf.envTime[4], PHASE_DONE - 1);
	}
}